

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgtextelement.cpp
# Opt level: O2

void __thiscall
lunasvg::SVGTextFragmentsBuilder::handleElement
          (SVGTextFragmentsBuilder *this,SVGTextPositioningElement *element)

{
  pointer pSVar1;
  pointer pSVar2;
  pointer pSVar3;
  char cVar4;
  int iVar5;
  SVGTextNode *node;
  SVGTextPositioningElement *element_00;
  _List_node_base *p_Var6;
  SVGNodeList *pSVar7;
  SVGTextPositioningElement *local_48;
  size_type local_40;
  size_type local_38;
  
  pSVar1 = (this->m_textPositions).
           super__Vector_base<lunasvg::SVGTextPosition,_std::allocator<lunasvg::SVGTextPosition>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pSVar2 = (this->m_textPositions).
           super__Vector_base<lunasvg::SVGTextPosition,_std::allocator<lunasvg::SVGTextPosition>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_40 = this->m_text->_M_string_length;
  local_48 = element;
  local_38 = local_40;
  std::vector<lunasvg::SVGTextPosition,std::allocator<lunasvg::SVGTextPosition>>::
  emplace_back<lunasvg::SVGTextPositioningElement_const*&,unsigned_long,unsigned_long>
            ((vector<lunasvg::SVGTextPosition,std::allocator<lunasvg::SVGTextPosition>> *)
             &this->m_textPositions,&local_48,&local_38,&local_40);
  pSVar7 = &(local_48->super_SVGGraphicsElement).super_SVGElement.m_children;
  p_Var6 = (_List_node_base *)pSVar7;
  while (p_Var6 = (((_List_base<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>,_std::allocator<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>_>_>
                     *)&p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var6 != (_List_node_base *)pSVar7) {
    cVar4 = (**(code **)(*(long *)p_Var6[1]._M_next + 0x10))();
    if (cVar4 == '\0') {
      iVar5 = (*((SVGNode *)p_Var6[1]._M_next)->_vptr_SVGNode[7])();
      if ((char)iVar5 != '\0') {
        element_00 = toSVGTextPositioningElement((SVGNode *)p_Var6[1]._M_next);
        handleElement(this,element_00);
      }
    }
    else {
      node = toSVGTextNode((SVGNode *)p_Var6[1]._M_next);
      handleText(this,node);
    }
  }
  pSVar3 = (this->m_textPositions).
           super__Vector_base<lunasvg::SVGTextPosition,_std::allocator<lunasvg::SVGTextPosition>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (*(SVGTextPositioningElement **)((long)pSVar2 + ((long)pSVar3 - (long)pSVar1)) == local_48) {
    *(size_type *)((long)pSVar2 + (long)pSVar3 + (0x10 - (long)pSVar1)) =
         this->m_text->_M_string_length;
    return;
  }
  __assert_fail("position.node == element",
                "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/source/svgtextelement.cpp"
                ,0x144,
                "void lunasvg::SVGTextFragmentsBuilder::handleElement(const SVGTextPositioningElement *)"
               );
}

Assistant:

void SVGTextFragmentsBuilder::handleElement(const SVGTextPositioningElement* element)
{
    const auto itemIndex = m_textPositions.size();
    m_textPositions.emplace_back(element, m_text.length(), m_text.length());
    for(const auto& child : element->children()) {
        if(child->isTextNode()) {
            handleText(toSVGTextNode(child.get()));
        } else if(child->isTextPositioningElement()) {
            handleElement(toSVGTextPositioningElement(child.get()));
        }
    }

    auto& position = m_textPositions[itemIndex];
    assert(position.node == element);
    position.endOffset = m_text.length();
}